

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O0

int Curl_cpool_check_limits(Curl_easy *data,connectdata *conn)

{
  curl_off_t cVar1;
  _Bool _Var2;
  cpool *cpool_00;
  size_t sVar3;
  connectdata *pcVar4;
  connectdata *local_88;
  connectdata *local_70;
  connectdata *oldest_idle_1;
  connectdata *oldest_idle;
  size_t live;
  size_t sStack_48;
  int result;
  size_t shutdowns;
  size_t total_limit;
  size_t dest_limit;
  cpool_bundle *bundle;
  cpool *cpool;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  cpool_00 = cpool_get_instance(data);
  total_limit = 0;
  shutdowns = 0;
  live._4_4_ = 0;
  if (cpool_00 == (cpool *)0x0) {
    return 0;
  }
  if (cpool_00->idata->multi != (Curl_multi *)0x0) {
    total_limit = cpool_00->idata->multi->max_host_connections;
    shutdowns = cpool_00->idata->multi->max_total_connections;
  }
  if ((total_limit == 0) && (shutdowns == 0)) {
    return 0;
  }
  if (cpool_00 != (cpool *)0x0) {
    if ((cpool_00->share != (Curl_share *)0x0) && ((cpool_00->share->specifier & 0x20) != 0)) {
      Curl_share_lock(cpool_00->idata,CURL_LOCK_DATA_CONNECT,CURL_LOCK_ACCESS_SINGLE);
    }
    cpool_00->field_0x68 = cpool_00->field_0x68 & 0xfe | 1;
  }
  if (total_limit != 0) {
    dest_limit = (size_t)cpool_find_bundle(cpool_00,conn);
    if ((cpool_bundle *)dest_limit == (cpool_bundle *)0x0) {
      local_70 = (connectdata *)0x0;
    }
    else {
      local_70 = (connectdata *)Curl_llist_count((Curl_llist *)dest_limit);
    }
    oldest_idle = local_70;
    sStack_48 = Curl_cshutdn_dest_count(data,conn->destination);
    while (total_limit <= (long)&(oldest_idle->cpool_node)._list + sStack_48) {
      if (sStack_48 == 0) {
        if ((dest_limit == 0) ||
           (pcVar4 = cpool_bundle_get_oldest_idle((cpool_bundle *)dest_limit),
           pcVar4 == (connectdata *)0x0)) break;
        if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0))
           && ((((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)
                ) && (0 < Curl_trc_feat_multi.log_level)))) {
          cVar1 = pcVar4->connection_id;
          sVar3 = Curl_llist_count((Curl_llist *)dest_limit);
          Curl_trc_multi(data,
                         "Discarding connection #%ld from %zu to reach destination limit of %zu",
                         cVar1,sVar3,total_limit);
        }
        Curl_conn_terminate(cpool_00->idata,pcVar4,false);
        dest_limit = (size_t)cpool_find_bundle(cpool_00,conn);
        if ((cpool_bundle *)dest_limit == (cpool_bundle *)0x0) {
          local_88 = (connectdata *)0x0;
        }
        else {
          local_88 = (connectdata *)Curl_llist_count((Curl_llist *)dest_limit);
        }
        oldest_idle = local_88;
      }
      else {
        _Var2 = Curl_cshutdn_close_oldest(data,conn->destination);
        if (!_Var2) break;
      }
      sStack_48 = Curl_cshutdn_dest_count(cpool_00->idata,conn->destination);
    }
    if (total_limit <= (long)&(oldest_idle->cpool_node)._list + sStack_48) {
      live._4_4_ = 1;
      goto LAB_0012210a;
    }
  }
  if (shutdowns != 0) {
    sStack_48 = Curl_cshutdn_count(cpool_00->idata);
    while (shutdowns <= cpool_00->num_conn + sStack_48) {
      if (sStack_48 == 0) {
        pcVar4 = cpool_get_oldest_idle(cpool_00);
        if (pcVar4 == (connectdata *)0x0) break;
        if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0))
            && (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)
                ))) && (0 < Curl_trc_feat_multi.log_level)) {
          Curl_trc_multi(data,"Discarding connection #%ld from %zu to reach total limit of %zu",
                         pcVar4->connection_id,cpool_00->num_conn,shutdowns);
        }
        Curl_conn_terminate(cpool_00->idata,pcVar4,false);
      }
      else {
        _Var2 = Curl_cshutdn_close_oldest(data,(char *)0x0);
        if (!_Var2) break;
      }
      sStack_48 = Curl_cshutdn_count(cpool_00->idata);
    }
    if (shutdowns <= cpool_00->num_conn + sStack_48) {
      live._4_4_ = 2;
    }
  }
LAB_0012210a:
  if (((cpool_00 != (cpool *)0x0) &&
      (cpool_00->field_0x68 = cpool_00->field_0x68 & 0xfe, cpool_00->share != (Curl_share *)0x0)) &&
     ((cpool_00->share->specifier & 0x20) != 0)) {
    Curl_share_unlock(cpool_00->idata,CURL_LOCK_DATA_CONNECT);
  }
  return live._4_4_;
}

Assistant:

int Curl_cpool_check_limits(struct Curl_easy *data,
                            struct connectdata *conn)
{
  struct cpool *cpool = cpool_get_instance(data);
  struct cpool_bundle *bundle;
  size_t dest_limit = 0;
  size_t total_limit = 0;
  size_t shutdowns;
  int result = CPOOL_LIMIT_OK;

  if(!cpool)
    return CPOOL_LIMIT_OK;

  if(cpool->idata->multi) {
    dest_limit = cpool->idata->multi->max_host_connections;
    total_limit = cpool->idata->multi->max_total_connections;
  }

  if(!dest_limit && !total_limit)
    return CPOOL_LIMIT_OK;

  CPOOL_LOCK(cpool, cpool->idata);
  if(dest_limit) {
    size_t live;

    bundle = cpool_find_bundle(cpool, conn);
    live = bundle ? Curl_llist_count(&bundle->conns) : 0;
    shutdowns = Curl_cshutdn_dest_count(data, conn->destination);
    while((live  + shutdowns) >= dest_limit) {
      if(shutdowns) {
        /* close one connection in shutdown right away, if we can */
        if(!Curl_cshutdn_close_oldest(data, conn->destination))
          break;
      }
      else if(!bundle)
        break;
      else {
        struct connectdata *oldest_idle = NULL;
        /* The bundle is full. Extract the oldest connection that may
         * be removed now, if there is one. */
        oldest_idle = cpool_bundle_get_oldest_idle(bundle);
        if(!oldest_idle)
          break;
        /* disconnect the old conn and continue */
        CURL_TRC_M(data, "Discarding connection #%"
                     FMT_OFF_T " from %zu to reach destination "
                     "limit of %zu", oldest_idle->connection_id,
                     Curl_llist_count(&bundle->conns), dest_limit);
        Curl_conn_terminate(cpool->idata, oldest_idle, FALSE);

        /* in case the bundle was destroyed in disconnect, look it up again */
        bundle = cpool_find_bundle(cpool, conn);
        live = bundle ? Curl_llist_count(&bundle->conns) : 0;
      }
      shutdowns = Curl_cshutdn_dest_count(cpool->idata, conn->destination);
    }
    if((live + shutdowns) >= dest_limit) {
      result = CPOOL_LIMIT_DEST;
      goto out;
    }
  }

  if(total_limit) {
    shutdowns = Curl_cshutdn_count(cpool->idata);
    while((cpool->num_conn + shutdowns) >= total_limit) {
      if(shutdowns) {
        /* close one connection in shutdown right away, if we can */
        if(!Curl_cshutdn_close_oldest(data, NULL))
          break;
      }
      else {
        struct connectdata *oldest_idle = cpool_get_oldest_idle(cpool);
        if(!oldest_idle)
          break;
        /* disconnect the old conn and continue */
        CURL_TRC_M(data, "Discarding connection #%"
                   FMT_OFF_T " from %zu to reach total "
                   "limit of %zu",
                   oldest_idle->connection_id, cpool->num_conn, total_limit);
        Curl_conn_terminate(cpool->idata, oldest_idle, FALSE);
      }
      shutdowns = Curl_cshutdn_count(cpool->idata);
    }
    if((cpool->num_conn + shutdowns) >= total_limit) {
      result = CPOOL_LIMIT_TOTAL;
      goto out;
    }
  }

out:
  CPOOL_UNLOCK(cpool, cpool->idata);
  return result;
}